

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagemap_unittest.cc
# Opt level: O1

void TestMap<TCMalloc_PageMap3<20>>(int limit,bool limit_is_below_the_overflow_boundary)

{
  bool bVar1;
  uint uVar2;
  size_t __i;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  n;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var3;
  long lVar4;
  Number i2;
  Node *pNVar5;
  uint uVar6;
  Number i3;
  char *pcVar7;
  pointer *__ptr;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var8;
  ulong uVar9;
  undefined1 local_1410 [8];
  TCMalloc_PageMap3<20> map;
  AssertHelper local_78;
  bool local_69;
  internal iStack_68;
  bool limit_is_below_the_overflow_boundary_local;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  AssertionResult gtest_ar_5;
  
  local_69 = limit_is_below_the_overflow_boundary;
  printf("Running test with %d iterations...\n");
  map.root_.ptrs[0x7f] = (Node *)malloc;
  memset(local_1410,0,0x400);
  n.
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        )(long)limit;
  if (0 < limit) {
    _Var3._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    do {
      TCMalloc_PageMap3<20>::Ensure
                ((TCMalloc_PageMap3<20> *)local_1410,(Number)_Var3._M_head_impl,1);
      _Var8._M_head_impl = _Var3._M_head_impl + 1;
      uVar2 = (uint)((ulong)_Var3._M_head_impl >> 6) & 0x7f;
      uVar6 = (uint)_Var3._M_head_impl & 0x3f;
      map.root_.ptrs[((ulong)_Var3._M_head_impl >> 0xd) - 1]->ptrs[uVar2]->ptrs[uVar6] =
           (Node *)_Var8._M_head_impl;
      if (((_Var3._M_head_impl < 0x100000) &&
          (pNVar5 = map.root_.ptrs[((ulong)_Var3._M_head_impl >> 0xd) - 1], pNVar5 != (Node *)0x0))
         && (pNVar5 = pNVar5->ptrs[uVar2], pNVar5 != (Node *)0x0)) {
        local_48._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             pNVar5->ptrs[uVar6];
      }
      else {
        local_48._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      gtest_ar_5.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )_Var8._M_head_impl;
      testing::internal::CmpHelperEQ<void*,void*>
                (&stack0xffffffffffffff98,"map.get(i)","(void*)(i+1)",&local_48._M_head_impl,
                 (void **)&gtest_ar_5.message_);
      if (iStack_68 == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        if (gtest_ar._0_8_ == 0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                   ,0x3b,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_5.message_,(Message *)&local_48);
        goto LAB_0010a769;
      }
      if (gtest_ar._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar._0_8_);
      }
      _Var3._M_head_impl = _Var8._M_head_impl;
    } while ((_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              )_Var8._M_head_impl !=
             n.
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  }
  if (0 < limit) {
    uVar9 = 0;
    do {
      if ((uVar9 < 0x100000) && (pNVar5 = map.root_.ptrs[(uVar9 >> 0xd) - 1], pNVar5 != (Node *)0x0)
         ) {
        pNVar5 = pNVar5->ptrs[(uint)(uVar9 >> 6) & 0x7f];
        if (pNVar5 == (Node *)0x0) goto LAB_0010a0d7;
        local_48._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             pNVar5->ptrs[(uint)uVar9 & 0x3f];
      }
      else {
LAB_0010a0d7:
        local_48._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      uVar9 = uVar9 + 1;
      gtest_ar_5.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )uVar9;
      testing::internal::CmpHelperEQ<void*,void*>
                (&stack0xffffffffffffff98,"map.get(i)","(void*)(i+1)",&local_48._M_head_impl,
                 (void **)&gtest_ar_5.message_);
      if (iStack_68 == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        if (gtest_ar._0_8_ == 0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                   ,0x3e,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_5.message_,(Message *)&local_48);
        goto LAB_0010a769;
      }
      if (gtest_ar._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar._0_8_);
      }
    } while (n.
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl !=
             (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              )uVar9);
  }
  map.root_.ptrs[0x7f] = (Node *)malloc;
  memset((TCMalloc_PageMap3<20> *)local_1410,0,0x400);
  TCMalloc_PageMap3<20>::Ensure
            ((TCMalloc_PageMap3<20> *)local_1410,0,
             (size_t)n.
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl);
  bVar1 = 0 < limit;
  if (0 < limit) {
    _Var3._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    do {
      _Var8._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&((_Var3._M_head_impl)->_M_dataplus)._M_p + 1);
      uVar2 = (uint)((ulong)_Var3._M_head_impl >> 6) & 0x7f;
      uVar6 = (uint)_Var3._M_head_impl & 0x3f;
      map.root_.ptrs[((ulong)_Var3._M_head_impl >> 0xd) - 1]->ptrs[uVar2]->ptrs[uVar6] =
           (Node *)_Var8._M_head_impl;
      if (((_Var3._M_head_impl <
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x100000) &&
          (pNVar5 = map.root_.ptrs[((ulong)_Var3._M_head_impl >> 0xd) - 1], pNVar5 != (Node *)0x0))
         && (pNVar5 = pNVar5->ptrs[uVar2], pNVar5 != (Node *)0x0)) {
        local_48._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             pNVar5->ptrs[uVar6];
      }
      else {
        local_48._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      gtest_ar_5.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )_Var8._M_head_impl;
      testing::internal::CmpHelperEQ<void*,void*>
                (&stack0xffffffffffffff98,"map.get(i)","(void*)(i+1)",&local_48._M_head_impl,
                 (void **)&gtest_ar_5.message_);
      if (iStack_68 == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        if (gtest_ar._0_8_ == 0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                   ,0x47,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_5.message_,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
        if (local_48._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_48._M_head_impl + 8))();
        }
        if (gtest_ar._0_8_ != 0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&gtest_ar,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       gtest_ar._0_8_);
        }
        if (bVar1) {
          return;
        }
        break;
      }
      if (gtest_ar._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar._0_8_);
      }
      bVar1 = (long)_Var8._M_head_impl <
              (long)n.
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl;
      _Var3._M_head_impl = _Var8._M_head_impl;
    } while ((_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              )_Var8._M_head_impl !=
             n.
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  }
  if (0 < limit) {
    uVar9 = 0;
    do {
      if ((uVar9 < 0x100000) && (pNVar5 = map.root_.ptrs[(uVar9 >> 0xd) - 1], pNVar5 != (Node *)0x0)
         ) {
        pNVar5 = pNVar5->ptrs[(uint)(uVar9 >> 6) & 0x7f];
        if (pNVar5 == (Node *)0x0) goto LAB_0010a37b;
        local_48._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             pNVar5->ptrs[(uint)uVar9 & 0x3f];
      }
      else {
LAB_0010a37b:
        local_48._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      uVar9 = uVar9 + 1;
      gtest_ar_5.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )uVar9;
      testing::internal::CmpHelperEQ<void*,void*>
                (&stack0xffffffffffffff98,"map.get(i)","(void*)(i+1)",&local_48._M_head_impl,
                 (void **)&gtest_ar_5.message_);
      if (iStack_68 == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        if (gtest_ar._0_8_ == 0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                   ,0x4a,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_5.message_,(Message *)&local_48);
LAB_0010a769:
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
        if (local_48._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_48._M_head_impl + 8))();
        }
        if (gtest_ar._0_8_ == 0) {
          return;
        }
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar._0_8_);
        return;
      }
      if (gtest_ar._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar._0_8_);
      }
    } while (n.
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl !=
             (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              )uVar9);
  }
  map.root_.ptrs[0x7f] = (Node *)malloc;
  memset((TCMalloc_PageMap3<20> *)local_1410,0,0x400);
  bVar1 = TCMalloc_PageMap3<20>::Ensure
                    ((TCMalloc_PageMap3<20> *)local_1410,
                     (Number)n.
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl,(long)(limit + 1));
  local_48._M_head_impl._0_1_ = (internal)bVar1;
  testing::internal::CmpHelperEQ<bool,bool>
            (&stack0xffffffffffffff98,"map.Ensure(limit, limit+1)",
             "limit_is_below_the_overflow_boundary",(bool *)&local_48,&local_69);
  if (iStack_68 == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar._0_8_ == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
               ,0x51,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_5.message_,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  if (iStack_68 != (internal)0x0) {
    _iStack_68 = (long *)0x0;
    gtest_ar.success_ = false;
    gtest_ar._1_7_ = 0;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    local_1410 = (undefined1  [8])0x0;
    if (0 < limit) {
      do {
        if ((__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             )gtest_ar._0_8_ ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl) {
          std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                    ((vector<long,std::allocator<long>> *)&stack0xffffffffffffff98,
                     (iterator)gtest_ar._0_8_,(long *)local_1410);
        }
        else {
          *(undefined1 (*) [8])gtest_ar._0_8_ = local_1410;
          gtest_ar._0_8_ = gtest_ar._0_8_ + 8;
        }
        local_1410 = (undefined1  [8])((long)(Node **)local_1410 + 1);
      } while ((long)local_1410 <
               (long)n.
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl);
    }
    local_1410 = (undefined1  [8])0x2a;
    lVar4 = 1;
    pNVar5 = (Node *)0x2a;
    do {
      pNVar5 = (Node *)(ulong)(((uint)((ulong)pNVar5 >> 0x1e) ^ (uint)pNVar5) * 0x6c078965 +
                              (int)lVar4);
      map.root_.ptrs[lVar4 + -1] = pNVar5;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x270);
    std::
    shuffle<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
              (_iStack_68,
               (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)gtest_ar._0_8_,
               (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *)local_1410);
    map.root_.ptrs[0x7f] = (Node *)malloc;
    memset(local_1410,0,0x400);
    if (0 < limit) {
      _Var3._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      do {
        TCMalloc_PageMap3<20>::Ensure
                  ((TCMalloc_PageMap3<20> *)local_1410,_iStack_68[(long)_Var3._M_head_impl],1);
        uVar9 = _iStack_68[(long)_Var3._M_head_impl];
        *(ulong *)(*(long *)((long)map.root_.ptrs[(uVar9 >> 0xd) - 1]->ptrs +
                            (ulong)((uint)uVar9 >> 3 & 0x3f8)) + (ulong)((uint)uVar9 & 0x3f) * 8) =
             uVar9 + 1;
        uVar9 = _iStack_68[(long)_Var3._M_head_impl];
        if ((uVar9 < 0x100000) &&
           (pNVar5 = map.root_.ptrs[(uVar9 >> 0xd) - 1], pNVar5 != (Node *)0x0)) {
          pNVar5 = pNVar5->ptrs[(uint)(uVar9 >> 6) & 0x7f];
          if (pNVar5 == (Node *)0x0) goto LAB_0010a63b;
          gtest_ar_5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )pNVar5->ptrs[(uint)uVar9 & 0x3f];
        }
        else {
LAB_0010a63b:
          gtest_ar_5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
        }
        local_78.data_ = (AssertHelperData *)(_iStack_68[(long)_Var3._M_head_impl] + 1);
        testing::internal::CmpHelperEQ<void*,void*>
                  ((internal *)&local_48,"map.get(elements[i])","(void*)(elements[i]+1)",
                   (void **)&gtest_ar_5.message_,&local_78.data_);
        if (local_48._M_head_impl._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&gtest_ar_5.message_);
          if (gtest_ar_5._0_8_ == 0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = *(char **)gtest_ar_5._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_78,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                     ,0x5d,pcVar7);
          testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar_5.message_);
          goto LAB_0010a831;
        }
        if (gtest_ar_5._0_8_ != 0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&gtest_ar_5,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       gtest_ar_5._0_8_);
        }
        _Var3._M_head_impl =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&((_Var3._M_head_impl)->_M_dataplus)._M_p + 1);
      } while (n.
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl !=
               (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                )_Var3._M_head_impl);
    }
    if (0 < limit) {
      _Var3._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
LAB_0010a6b0:
      if ((_Var3._M_head_impl <
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x100000) &&
         (pNVar5 = map.root_.ptrs[((ulong)_Var3._M_head_impl >> 0xd) - 1], pNVar5 != (Node *)0x0)) {
        pNVar5 = pNVar5->ptrs[(uint)((ulong)_Var3._M_head_impl >> 6) & 0x7f];
        if (pNVar5 == (Node *)0x0) goto LAB_0010a6eb;
        gtest_ar_5.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )pNVar5->ptrs[(uint)_Var3._M_head_impl & 0x3f];
      }
      else {
LAB_0010a6eb:
        gtest_ar_5.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
      }
      _Var3._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&((_Var3._M_head_impl)->_M_dataplus)._M_p + 1);
      local_78.data_ = (AssertHelperData *)_Var3._M_head_impl;
      testing::internal::CmpHelperEQ<void*,void*>
                ((internal *)&local_48,"map.get(i)","(void*)(i+1)",(void **)&gtest_ar_5.message_,
                 &local_78.data_);
      if (local_48._M_head_impl._0_1_ != (internal)0x0) goto code_r0x0010a71a;
      testing::Message::Message((Message *)&gtest_ar_5.message_);
      if (gtest_ar_5._0_8_ == 0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)gtest_ar_5._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                 ,0x60,pcVar7);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar_5.message_);
LAB_0010a831:
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_5.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        (**(code **)(*(long *)gtest_ar_5.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 8))();
      }
      if (gtest_ar_5._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar_5,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar_5._0_8_);
      }
    }
LAB_0010a85b:
    if (_iStack_68 != (long *)0x0) {
      operator_delete(_iStack_68,
                      (long)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl - (long)_iStack_68);
    }
  }
  return;
code_r0x0010a71a:
  if (gtest_ar_5._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar_5,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar_5._0_8_);
  }
  if (n.
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl ==
      (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       )_Var3._M_head_impl) goto LAB_0010a85b;
  goto LAB_0010a6b0;
}

Assistant:

void TestMap(int limit, bool limit_is_below_the_overflow_boundary) {
  printf("Running test with %d iterations...\n", limit);

  { // Test sequential ensure/assignment
    Type map(malloc);
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      map.Ensure(i, 1);
      map.set(i, (void*)(i+1));
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
  }

  { // Test bulk Ensure
    Type map(malloc);
    map.Ensure(0, limit);
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      map.set(i, (void*)(i+1));
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
  }

  // Test that we correctly notice overflow
  {
    Type map(malloc);
    ASSERT_EQ(map.Ensure(limit, limit+1), limit_is_below_the_overflow_boundary);
  }

  { // Test randomized accesses
    std::vector<intptr_t> elements;
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) elements.push_back(i);
    std::shuffle(elements.begin(), elements.end(), std::mt19937(42));

    Type map(malloc);
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      map.Ensure(elements[i], 1);
      map.set(elements[i], (void*)(elements[i]+1));
      ASSERT_EQ(map.get(elements[i]), (void*)(elements[i]+1));
    }
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
  }
}